

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O3

bool __thiscall
gl4cts::UncommittedRegionsAccessTestCase::verifyAtomicOperations
          (UncommittedRegionsAccessTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  undefined1 *this_00;
  pointer *__x;
  UncommittedRegionsAccessTestCase *pUVar1;
  _Alloc_hider _Var2;
  pointer __s;
  pointer puVar3;
  GLenum GVar4;
  int iVar5;
  GLint GVar6;
  int iVar7;
  ostream *poVar8;
  undefined8 extraout_RAX;
  size_t sVar9;
  TestError *this_01;
  GLint GVar10;
  GLint GVar11;
  undefined4 in_register_0000000c;
  int iVar12;
  long lVar13;
  Functions *pFVar14;
  int iVar15;
  SparseTexture2CommitmentTestCase *this_02;
  char *pcVar16;
  size_type __new_size;
  byte bVar17;
  GLint depth;
  GLint height;
  GLint width;
  GLenum local_414;
  int local_410;
  undefined4 local_40c;
  GLuint verifyTexture;
  GLint local_404;
  undefined8 local_400;
  Functions *local_3f8;
  int local_3f0;
  GLint local_3ec;
  ostream *local_3e8;
  UncommittedRegionsAccessTestCase *local_3e0;
  string shader;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData;
  string dataType;
  string local_378;
  string local_358;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData;
  ShaderProgram program;
  ProgramSources sources;
  TokenStrings s;
  
  local_400 = CONCAT44(in_register_0000000c,format);
  this_00 = &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
             field_0x88;
  local_3f8 = gl;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Verify Atomic Operations [level: ",0x21);
  local_3e8 = (ostream *)this_00;
  poVar8 = (ostream *)std::ostream::operator<<(this_00,level);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] - ",4);
  if ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
      levels + -1 < level) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Invalid level",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
               ,0x75e);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  SparseTextureUtils::getTextureLevelSize
            (target,&(this->super_SparseTexture2CommitmentTestCase).
                     super_SparseTextureCommitmentTestCase.mState,level,&width,&height,&depth);
  GVar6 = width;
  bVar17 = 1;
  if ((height != 0 && 2 < width + 1U) &&
     ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
      minDepth <= depth)) {
    local_414 = 0x8c1a;
    if (target == 0x9100) {
      local_414 = 0xde1;
    }
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __new_size = (size_type)(height * width * depth);
    local_404 = target;
    local_3ec = level;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecExpData,__new_size);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecOutData,__new_size);
    puVar3 = vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    __s = vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
    memset(vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,0,__new_size);
    pFVar14 = local_3f8;
    gl4cts::Texture::Generate(local_3f8,&verifyTexture);
    gl4cts::Texture::Bind(pFVar14,verifyTexture,local_414);
    gl4cts::Texture::Storage(pFVar14,local_414,1,0x8229,width,height,depth);
    GVar4 = (*pFVar14->getError)();
    glu::checkError(GVar4,"Texture::Storage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                    ,0x784);
    if ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
        samples < 1) {
      local_40c = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    }
    else {
      local_3f0 = GVar6 / 2;
      __x = &program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
      local_40c = (undefined4)CONCAT71((uint7)(uint3)(GVar6 - (GVar6 >> 0x1f) >> 9),1);
      local_410 = 0;
      local_3e0 = this;
      do {
        memset(__s,0xff,__new_size);
        gl4cts::Texture::Bind(pFVar14,verifyTexture,local_414);
        gl4cts::Texture::SubImage(pFVar14,local_414,0,0,0,0,width,height,depth,0x1903,0x1401,__s);
        GVar4 = (*pFVar14->getError)();
        glu::checkError(GVar4,"Texture::SubImage",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x78d);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&shader,st2_compute_atomicVerify,(allocator<char> *)&s);
        local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"image","");
        local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
        this_02 = (SparseTexture2CommitmentTestCase *)0x1ba18f4;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"image","");
        SparseTexture2CommitmentTestCase::createShaderTokens
                  (&s,this_02,local_404,(GLint)local_400,local_410,&local_378,&local_358);
        pUVar1 = local_3e0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
        iVar5 = std::__cxx11::string::compare((char *)&s.returnType);
        pcVar16 = "uint";
        if (iVar5 == 0) {
          pcVar16 = "int";
        }
        dataType._M_dataplus._M_p = (pointer)&dataType.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&dataType,pcVar16,pcVar16 + (4 - (ulong)(iVar5 == 0)));
        replaceToken("<OUTPUT_TYPE>",s.outputType._M_dataplus._M_p,&shader);
        replaceToken("<FORMAT>",s.format._M_dataplus._M_p,&shader);
        replaceToken("<INPUT_TYPE>",s.inputType._M_dataplus._M_p,&shader);
        replaceToken("<POINT_TYPE>",s.pointType._M_dataplus._M_p,&shader);
        replaceToken("<POINT_DEF>",s.pointDef._M_dataplus._M_p,&shader);
        replaceToken("<DATA_TYPE>",dataType._M_dataplus._M_p,&shader);
        replaceToken("<SAMPLE_DEF>",s.sampleDef._M_dataplus._M_p,&shader);
        replaceToken("<RETURN_TYPE>",s.returnType._M_dataplus._M_p,&shader);
        memset(&sources,0,0xac);
        sources.transformFeedbackVaryings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        sources.transformFeedbackVaryings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        sources.transformFeedbackVaryings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
        sources.transformFeedbackVaryings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        sources._193_8_ = 0;
        program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = 5;
        program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)(program.m_shaders + 1);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__x,shader._M_dataplus._M_p,
                   shader._M_dataplus._M_p + shader._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(sources.sources +
                    (uint)program.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_start,(value_type *)__x);
        pFVar14 = local_3f8;
        if ((vector<glu::Shader_*,_std::allocator<glu::Shader_*>_> *)
            program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != program.m_shaders + 1) {
          operator_delete(program.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_finish,
                          (long)program.m_shaders[1].
                                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                _M_impl.super__Vector_impl_data._M_start + 1);
        }
        glu::ShaderProgram::ShaderProgram
                  (&program,((pUVar1->super_SparseTexture2CommitmentTestCase).
                             super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->
                            m_renderCtx,&sources);
        if (program.m_program.m_info.linkOk == true) {
          (*pFVar14->useProgram)(program.m_program.m_program);
          GVar4 = (*pFVar14->getError)();
          glu::checkError(GVar4,"glUseProgram",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7a6);
          (*pFVar14->bindImageTexture)(0,verifyTexture,0,'\0',0,0x88b9,0x8232);
          GVar4 = (*pFVar14->getError)();
          glu::checkError(GVar4,"glBindImageTexture",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7ad);
          (*pFVar14->bindImageTexture)(1,*texture,local_3ec,'\0',0,35000,(GLenum)local_400);
          GVar4 = (*pFVar14->getError)();
          glu::checkError(GVar4,"glBindImageTexture",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7b4);
          (*pFVar14->uniform1i)(1,0);
          GVar4 = (*pFVar14->getError)();
          glu::checkError(GVar4,"glUniform1i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7b6);
          (*pFVar14->uniform1i)(2,1);
          GVar4 = (*pFVar14->getError)();
          glu::checkError(GVar4,"glUniform1i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7b8);
          (*pFVar14->uniform1i)(3,local_3f0);
          GVar4 = (*pFVar14->getError)();
          glu::checkError(GVar4,"glUniform1i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7ba);
          (*pFVar14->dispatchCompute)(width,height,depth);
          GVar4 = (*pFVar14->getError)();
          glu::checkError(GVar4,"glDispatchCompute",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7bc);
          (*pFVar14->memoryBarrier)(0xffffffff);
          GVar4 = (*pFVar14->getError)();
          glu::checkError(GVar4,"glMemoryBarrier",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7be);
          gl4cts::Texture::GetData(pFVar14,0,local_414,0x1903,0x1401,__s);
          GVar4 = (*pFVar14->getError)();
          glu::checkError(GVar4,"Texture::GetData",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x7c1);
          if (0 < width) {
            iVar5 = 0;
            GVar6 = height;
            GVar10 = width;
            do {
              if (0 < GVar6) {
                iVar12 = 0;
                GVar11 = depth;
                do {
                  if (0 < GVar11) {
                    iVar15 = 0;
                    do {
                      iVar7 = (height * iVar15 + iVar12) * width + iVar5;
                      if (puVar3[iVar7] != __s[iVar7]) {
                        local_40c = 0;
                        printf("%d:%d ");
                        GVar11 = depth;
                      }
                      iVar15 = iVar15 + 1;
                      GVar6 = height;
                    } while (iVar15 < GVar11);
                  }
                  iVar12 = iVar12 + 1;
                  GVar10 = width;
                } while (iVar12 < GVar6);
              }
              iVar5 = iVar5 + 1;
            } while (iVar5 < GVar10);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_3e8,"Compute shader compilation failed (atomic) for target: ",0x37);
          poVar8 = (ostream *)std::ostream::operator<<(local_3e8,local_404);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,", format: ",10);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)local_400);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,", sample: ",10);
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_410);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,", infoLog: ",0xb);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,((*program.m_shaders[5].
                                        super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                                     _M_dataplus._M_p,
                              ((*program.m_shaders[5].
                                 super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                              _M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,", shaderSource: ",0x10);
          _Var2 = shader._M_dataplus;
          if (shader._M_dataplus._M_p == (pointer)0x0) {
            std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
          }
          else {
            sVar9 = strlen(shader._M_dataplus._M_p);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,_Var2._M_p,sVar9);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," - ",3);
          local_40c = 0;
        }
        glu::ShaderProgram::~ShaderProgram(&program);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&sources.transformFeedbackVaryings);
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
        ~vector(&sources.attribLocationBindings);
        lVar13 = 0x78;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&sources.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar13));
          pUVar1 = local_3e0;
          lVar13 = lVar13 + -0x18;
        } while (lVar13 != -0x18);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dataType._M_dataplus._M_p != &dataType.field_2) {
          operator_delete(dataType._M_dataplus._M_p,dataType.field_2._M_allocated_capacity + 1);
        }
        SparseTexture2CommitmentTestCase::TokenStrings::~TokenStrings(&s);
        pFVar14 = local_3f8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)shader._M_dataplus._M_p != &shader.field_2) {
          operator_delete(shader._M_dataplus._M_p,shader.field_2._M_allocated_capacity + 1);
        }
        local_410 = local_410 + 1;
      } while (local_410 <
               (pUVar1->super_SparseTexture2CommitmentTestCase).
               super_SparseTextureCommitmentTestCase.mState.samples);
    }
    gl4cts::Texture::Delete(pFVar14,&verifyTexture);
    bVar17 = (byte)local_40c;
    if (vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)vecOutData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vecOutData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)vecExpData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vecExpData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return (bool)(bVar17 & 1);
}

Assistant:

bool UncommittedRegionsAccessTestCase::verifyAtomicOperations(const Functions& gl, GLint target, GLint format,
															  GLuint& texture, GLint level)
{
	mLog << "Verify Atomic Operations [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	//Committed region is limited to 1/2 of width
	GLint widthCommitted = width / 2;

	if (widthCommitted == 0 || height == 0 || depth < mState.minDepth)
		return true;

	bool result = true;

	// Create verifying texture
	GLint verifyTarget;
	if (target == GL_TEXTURE_2D_MULTISAMPLE)
		verifyTarget = GL_TEXTURE_2D;
	else
		verifyTarget = GL_TEXTURE_2D_ARRAY;

	GLint texSize = width * height * depth;

	std::vector<GLubyte> vecExpData;
	std::vector<GLubyte> vecOutData;
	vecExpData.resize(texSize);
	vecOutData.resize(texSize);
	GLubyte* exp_data = vecExpData.data();
	GLubyte* out_data = vecOutData.data();

	// Expected value in this case is 0 because atomic operations result on uncommitted regions are zeros
	deMemset(exp_data, 0, texSize);

	GLuint verifyTexture;
	Texture::Generate(gl, verifyTexture);
	Texture::Bind(gl, verifyTexture, verifyTarget);
	Texture::Storage(gl, verifyTarget, 1, GL_R8, width, height, depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::Storage");

	for (GLint sample = 0; sample < mState.samples; ++sample)
	{
		deMemset(out_data, 255, texSize);

		Texture::Bind(gl, verifyTexture, verifyTarget);
		Texture::SubImage(gl, verifyTarget, 0, 0, 0, 0, width, height, depth, GL_RED, GL_UNSIGNED_BYTE,
						  (GLvoid*)out_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::SubImage");

		std::string shader = st2_compute_atomicVerify;

		// Adjust shader source to texture format
		TokenStrings s		  = createShaderTokens(target, format, sample);
		std::string  dataType = (s.returnType == "ivec4" ? "int" : "uint");

		replaceToken("<OUTPUT_TYPE>", s.outputType.c_str(), shader);
		replaceToken("<FORMAT>", s.format.c_str(), shader);
		replaceToken("<INPUT_TYPE>", s.inputType.c_str(), shader);
		replaceToken("<POINT_TYPE>", s.pointType.c_str(), shader);
		replaceToken("<POINT_DEF>", s.pointDef.c_str(), shader);
		replaceToken("<DATA_TYPE>", dataType.c_str(), shader);
		replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), shader);
		replaceToken("<RETURN_TYPE>", s.returnType.c_str(), shader);

		ProgramSources sources;
		sources << ComputeSource(shader);

		// Build and run shader
		ShaderProgram program(m_context.getRenderContext(), sources);
		if (program.isOk())
		{
			gl.useProgram(program.getProgram());
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");
			gl.bindImageTexture(0, //unit
								verifyTexture,
								0,		  //level
								GL_FALSE, //layered
								0,		  //layer
								GL_WRITE_ONLY, GL_R8UI);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
			gl.bindImageTexture(1, //unit
								texture,
								level,	//level
								GL_FALSE, //layered
								0,		  //layer
								GL_READ_ONLY, format);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
			gl.uniform1i(1, 0 /* image_unit */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
			gl.uniform1i(2, 1 /* image_unit */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
			gl.uniform1i(3, widthCommitted /* committed width */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
			gl.dispatchCompute(width, height, depth);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute");
			gl.memoryBarrier(GL_ALL_BARRIER_BITS);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier");

			Texture::GetData(gl, 0, verifyTarget, GL_RED, GL_UNSIGNED_BYTE, (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

			//Verify only committed region
			for (GLint x = 0; x < width; ++x)
				for (GLint y = 0; y < height; ++y)
					for (GLint z = 0; z < depth; ++z)
					{
						GLubyte* dataRegion	= exp_data + ((x + y * width) + z * width * height);
						GLubyte* outDataRegion = out_data + ((x + y * width) + z * width * height);
						if (dataRegion[0] != outDataRegion[0])
						{
							printf("%d:%d ", dataRegion[0], outDataRegion[0]);
							result = false;
						}
					}
		}
		else
		{
			mLog << "Compute shader compilation failed (atomic) for target: " << target << ", format: " << format
				 << ", sample: " << sample << ", infoLog: " << program.getShaderInfo(SHADERTYPE_COMPUTE).infoLog
				 << ", shaderSource: " << shader.c_str() << " - ";

			result = false;
		}
	}

	Texture::Delete(gl, verifyTexture);

	return result;
}